

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::unmap_range<long>(Omega_h *this,LO begin,LO end,Read<signed_char> *b_data,Int width)

{
  int *piVar1;
  undefined8 *puVar2;
  Alloc *pAVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  Read<signed_char> RVar5;
  Write<signed_char> a_data;
  type f;
  Write<long> local_78;
  type local_68;
  Write<long> local_40;
  
  if (begin <= end) {
    puVar2 = &local_68.a_data.shared_alloc_.direct_ptr;
    local_68._0_8_ = puVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    Write<long>::Write(&local_78,(end - begin) * width,(string *)&local_68);
    if ((undefined8 *)local_68._0_8_ != puVar2) {
      operator_delete((void *)local_68._0_8_,(long)local_68.a_data.shared_alloc_.direct_ptr + 1);
    }
    local_68.width = width;
    local_68.begin = begin;
    local_68.a_data.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.a_data.shared_alloc_.alloc =
             (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.a_data.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
    local_68.b_data.write_.shared_alloc_.alloc = (b_data->write_).shared_alloc_.alloc;
    if (((ulong)local_68.b_data.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.b_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.b_data.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.b_data.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.b_data.write_.shared_alloc_.alloc)->use_count =
             (local_68.b_data.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.b_data.write_.shared_alloc_.direct_ptr = (b_data->write_).shared_alloc_.direct_ptr;
    parallel_for<Omega_h::unmap_range<long>(int,int,Omega_h::Read<long>,int)::_lambda(int)_1_>
              (end - begin,&local_68,"unmap_range");
    local_40.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
    local_40.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
    if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
         local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
      local_40.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_78.shared_alloc_.alloc = (Alloc *)0x0;
    local_78.shared_alloc_.direct_ptr = (void *)0x0;
    Read<long>::Read((Read<signed_char> *)this,&local_40);
    pAVar3 = local_40.shared_alloc_.alloc;
    pvVar4 = extraout_RDX;
    if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 &&
        local_40.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_40.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_40.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX_00;
      }
    }
    pAVar3 = local_68.b_data.write_.shared_alloc_.alloc;
    if (((ulong)local_68.b_data.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.b_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = (int *)((long)local_68.b_data.write_.shared_alloc_.alloc + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.b_data.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX_01;
      }
    }
    pAVar3 = local_68.a_data.shared_alloc_.alloc;
    if (((ulong)local_68.a_data.shared_alloc_.alloc & 7) == 0 &&
        local_68.a_data.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.a_data.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.a_data.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX_02;
      }
    }
    pAVar3 = local_78.shared_alloc_.alloc;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
        pvVar4 = extraout_RDX_03;
      }
    }
    RVar5.write_.shared_alloc_.direct_ptr = pvVar4;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar5.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","begin <= end",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x5b);
}

Assistant:

Read<T> unmap_range(LO begin, LO end, Read<T> b_data, Int width) {
  OMEGA_H_CHECK(begin <= end);
  auto na = end - begin;
  Write<T> a_data(na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a + begin;
    for (Int j = 0; j < width; ++j) {
      a_data[a * width + j] = b_data[b * width + j];
    }
  };
  parallel_for(na, f, "unmap_range");
  return a_data;
}